

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O3

Read<int> __thiscall
Omega_h::interleave<int>
          (Omega_h *this,vector<Omega_h::Read<int>,_std::allocator<Omega_h::Read<int>_>_> *arrays)

{
  int *piVar1;
  ulong *puVar2;
  ulong *puVar3;
  size_t sVar4;
  Alloc *pAVar5;
  undefined8 uVar6;
  _Alloc_hider _Var7;
  ulong *puVar8;
  void *in_RDX;
  ulong uVar9;
  ulong uVar10;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  long lVar11;
  int n;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  Read<int> RVar15;
  Write<int> out;
  type f;
  value_type array;
  uint local_b0;
  Write<int> local_a8;
  undefined1 local_90 [16];
  Alloc local_80;
  void *local_38;
  
  puVar8 = *(ulong **)arrays;
  puVar2 = *(ulong **)(arrays + 8);
  if (puVar8 == puVar2) {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    uVar9 = (long)puVar2 - (long)puVar8;
    puVar3 = (ulong *)*puVar8;
    if (((ulong)puVar3 & 1) == 0) {
      uVar12 = *puVar3;
    }
    else {
      uVar12 = (ulong)puVar3 >> 3;
    }
    do {
      puVar3 = (ulong *)*puVar8;
      if (((ulong)puVar3 & 1) == 0) {
        uVar10 = *puVar3;
      }
      else {
        uVar10 = (ulong)puVar3 >> 3;
      }
      n = (int)(uVar12 >> 2);
      local_80.prev = (Alloc *)arrays;
      if ((int)(uVar10 >> 2) != n) {
        fail("assertion %s failed at %s +%d\n","array.size() == array_size",
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
             ,0x1b3);
      }
      puVar8 = puVar8 + 2;
    } while (puVar8 != puVar2);
    local_90._0_8_ = &local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
    local_b0 = (uint)(uVar9 >> 4);
    Write<int>::Write(&local_a8,n * local_b0,(string *)local_90);
    local_80.ptr = this;
    if ((Alloc *)local_90._0_8_ != &local_80) {
      operator_delete((void *)local_90._0_8_,
                      CONCAT44(local_80.size._4_4_,(undefined4)local_80.size) + 1);
    }
    if (0 < (int)local_b0) {
      local_80._48_8_ = ZEXT48(local_b0 & 0x7fffffff);
      lVar11 = 8;
      uVar9 = 0;
      do {
        sVar4 = (local_80.prev)->size;
        local_80.next = *(Alloc **)((sVar4 - 8) + lVar11);
        if (((ulong)local_80.next & 7) == 0 && local_80.next != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_80.next = (Alloc *)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        pAVar5 = local_80.next;
        local_80.name._M_string_length = *(size_type *)(sVar4 + lVar11);
        local_90._0_8_ = local_a8.shared_alloc_.alloc;
        if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
            local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
          if (entering_parallel == '\x01') {
            local_90._0_8_ = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
          }
          else {
            (local_a8.shared_alloc_.alloc)->use_count =
                 (local_a8.shared_alloc_.alloc)->use_count + 1;
          }
        }
        local_90._8_8_ = local_a8.shared_alloc_.direct_ptr;
        local_80.size._4_4_ = (undefined4)uVar9;
        bVar13 = local_80.next != (Alloc *)0x0;
        bVar14 = ((ulong)local_80.next & 7) == 0;
        local_80.name._M_dataplus._M_p = (pointer)local_80.next;
        if (bVar14 && bVar13) {
          if (entering_parallel == '\x01') {
            local_80.name._M_dataplus._M_p = (pointer)((local_80.next)->size * 8 + 1);
          }
          else {
            (local_80.next)->use_count = (local_80.next)->use_count + 1;
          }
        }
        local_80.size._0_4_ = local_b0;
        local_38 = (void *)local_80.name._M_string_length;
        parallel_for<Omega_h::interleave<int>(std::vector<Omega_h::Read<int>,std::allocator<Omega_h::Read<int>>>)::_lambda(int)_1_>
                  (n,(type *)local_90,"interleave");
        _Var7._M_p = local_80.name._M_dataplus._M_p;
        if (((ulong)local_80.name._M_dataplus._M_p & 7) == 0 &&
            (Alloc *)local_80.name._M_dataplus._M_p != (Alloc *)0x0) {
          piVar1 = (int *)((long)local_80.name._M_dataplus._M_p + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_80.name._M_dataplus._M_p);
            operator_delete(_Var7._M_p,0x48);
          }
        }
        uVar6 = local_90._0_8_;
        if ((local_90._0_8_ & 7) == 0 && (Alloc *)local_90._0_8_ != (Alloc *)0x0) {
          piVar1 = (int *)(local_90._0_8_ + 0x30);
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc((Alloc *)local_90._0_8_);
            operator_delete((void *)uVar6,0x48);
          }
        }
        if (bVar14 && bVar13) {
          piVar1 = &pAVar5->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(pAVar5);
            operator_delete(pAVar5,0x48);
          }
        }
        uVar9 = uVar9 + 1;
        lVar11 = lVar11 + 0x10;
      } while (local_80._48_8_ != uVar9);
    }
    this = (Omega_h *)local_80.ptr;
    local_80.name.field_2._M_allocated_capacity = (size_type)local_a8.shared_alloc_.alloc;
    local_80.name.field_2._8_8_ = local_a8.shared_alloc_.direct_ptr;
    if ((((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
         local_a8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_a8.shared_alloc_.alloc)->use_count = (local_a8.shared_alloc_.alloc)->use_count + -1;
      local_80.name.field_2._M_allocated_capacity = (local_a8.shared_alloc_.alloc)->size * 8 + 1;
    }
    local_a8.shared_alloc_.alloc = (Alloc *)0x0;
    local_a8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<int>::Read((Read<signed_char> *)local_80.ptr,(Write<int> *)&local_80.name.field_2);
    uVar6 = local_80.name.field_2._M_allocated_capacity;
    in_RDX = extraout_RDX;
    if ((local_80.name.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_80.name.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_80.name.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_80.name.field_2._M_allocated_capacity);
        operator_delete((void *)uVar6,0x48);
        in_RDX = extraout_RDX_00;
      }
    }
    pAVar5 = local_a8.shared_alloc_.alloc;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar5,0x48);
        in_RDX = extraout_RDX_01;
      }
    }
  }
  RVar15.write_.shared_alloc_.direct_ptr = in_RDX;
  RVar15.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar15.write_.shared_alloc_;
}

Assistant:

Read<T> interleave(std::vector<Read<T>> arrays) {
  if (arrays.empty()) return Read<T>();
  auto narrays = LO(arrays.size());
  auto array_size = arrays.front().size();
  for (auto& array : arrays) OMEGA_H_CHECK(array.size() == array_size);
  auto out_size = narrays * array_size;
  auto out = Write<T>(out_size);
  for (LO i = 0; i < narrays; ++i) {
    auto array = arrays[std::size_t(i)];
    auto f = OMEGA_H_LAMBDA(LO j) { out[j * narrays + i] = array[j]; };
    parallel_for(array_size, f, "interleave");
  }
  return out;
}